

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::FunctionPointerPrinter::
     PrintValue<void(int_const*,unsigned_char_const*,int,int,int,unsigned_char*,int,int,int,int,int,int,int,ConvolveParams*,short,short,short,short),void>
               (_func_void_int_ptr_uchar_ptr_int_int_int_uchar_ptr_int_int_int_int_int_int_int_ConvolveParams_ptr_short_short_short_short
                *p,ostream *os)

{
  if (p != (_func_void_int_ptr_uchar_ptr_int_int_int_uchar_ptr_int_int_int_int_int_int_int_ConvolveParams_ptr_short_short_short_short
            *)0x0) {
    std::ostream::_M_insert<void_const*>(os);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is a function type, so '*os << p' doesn't do what we want
      // (it just prints p as bool).  We want to print p as a const
      // void*.
      *os << reinterpret_cast<const void*>(p);
    }
  }